

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O3

FT_Error FT_Bitmap_Copy(FT_Library library,FT_Bitmap *source,FT_Bitmap *target)

{
  uint uVar1;
  uint uVar2;
  unsigned_short uVar3;
  uchar uVar4;
  uchar uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  uchar *puVar9;
  long cur_count;
  uchar *__src;
  uint uVar10;
  size_t __n;
  uint uVar11;
  uint uVar12;
  ulong __n_00;
  FT_Error error;
  FT_Error local_3c;
  size_t local_38;
  
  local_3c = 0;
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (target == (FT_Bitmap *)0x0 || source == (FT_Bitmap *)0x0) {
    return 6;
  }
  if (source == target) {
    return 0;
  }
  uVar12 = source->pitch;
  uVar10 = (int)uVar12 >> 0x1f | 1;
  uVar1 = target->pitch;
  uVar11 = (int)uVar1 >> 0x1f | 1;
  if (source->buffer == (uchar *)0x0) {
    target->palette = source->palette;
    uVar12 = source->rows;
    uVar1 = source->width;
    iVar7 = source->pitch;
    uVar8 = *(undefined4 *)&source->field_0xc;
    uVar3 = source->num_grays;
    uVar4 = source->pixel_mode;
    uVar5 = source->palette_mode;
    uVar6 = *(undefined4 *)&source->field_0x1c;
    target->buffer = source->buffer;
    target->num_grays = uVar3;
    target->pixel_mode = uVar4;
    target->palette_mode = uVar5;
    *(undefined4 *)&target->field_0x1c = uVar6;
    target->rows = uVar12;
    target->width = uVar1;
    target->pitch = iVar7;
    *(undefined4 *)&target->field_0xc = uVar8;
    if (uVar10 == uVar11) {
      return 0;
    }
    target->pitch = -target->pitch;
    return 0;
  }
  uVar2 = -uVar12;
  if (0 < (int)uVar12) {
    uVar2 = uVar12;
  }
  __n_00 = (ulong)uVar2;
  __n = source->rows * __n_00;
  puVar9 = target->buffer;
  if (puVar9 == (uchar *)0x0) {
    local_38 = __n;
    puVar9 = (uchar *)ft_mem_qalloc(library->memory,__n,&local_3c);
  }
  else {
    uVar12 = -uVar1;
    if (0 < (int)uVar1) {
      uVar12 = uVar1;
    }
    cur_count = (ulong)target->rows * (ulong)uVar12;
    if (cur_count - __n == 0) goto LAB_00184c64;
    local_38 = __n;
    puVar9 = (uchar *)ft_mem_qrealloc(library->memory,1,cur_count,__n,puVar9,&local_3c);
  }
  target->buffer = puVar9;
  __n = local_38;
LAB_00184c64:
  if (local_3c == 0) {
    uVar12 = source->rows;
    uVar1 = source->width;
    iVar7 = source->pitch;
    uVar8 = *(undefined4 *)&source->field_0xc;
    uVar3 = source->num_grays;
    uVar4 = source->pixel_mode;
    uVar5 = source->palette_mode;
    uVar6 = *(undefined4 *)&source->field_0x1c;
    target->buffer = source->buffer;
    target->num_grays = uVar3;
    target->pixel_mode = uVar4;
    target->palette_mode = uVar5;
    *(undefined4 *)&target->field_0x1c = uVar6;
    target->palette = source->palette;
    target->rows = uVar12;
    target->width = uVar1;
    target->pitch = iVar7;
    *(undefined4 *)&target->field_0xc = uVar8;
    target->buffer = puVar9;
    if (uVar10 == uVar11) {
      memcpy(puVar9,source->buffer,__n);
    }
    else {
      uVar12 = target->rows;
      if (uVar12 != 0) {
        puVar9 = puVar9 + (uVar12 - 1) * __n_00;
        __src = source->buffer;
        do {
          memcpy(puVar9,__src,__n_00);
          __src = __src + __n_00;
          puVar9 = puVar9 + -__n_00;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
    }
  }
  return local_3c;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Copy( FT_Library        library,
                  const FT_Bitmap  *source,
                  FT_Bitmap        *target)
  {
    FT_Memory  memory;
    FT_Error   error  = FT_Err_Ok;

    FT_Int    pitch;
    FT_ULong  size;

    FT_Int  source_pitch_sign, target_pitch_sign;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !source || !target )
      return FT_THROW( Invalid_Argument );

    if ( source == target )
      return FT_Err_Ok;

    source_pitch_sign = source->pitch < 0 ? -1 : 1;
    target_pitch_sign = target->pitch < 0 ? -1 : 1;

    if ( !source->buffer )
    {
      *target = *source;
      if ( source_pitch_sign != target_pitch_sign )
        target->pitch = -target->pitch;

      return FT_Err_Ok;
    }

    memory = library->memory;
    pitch  = source->pitch;

    if ( pitch < 0 )
      pitch = -pitch;
    size = (FT_ULong)pitch * source->rows;

    if ( target->buffer )
    {
      FT_Int    target_pitch = target->pitch;
      FT_ULong  target_size;


      if ( target_pitch < 0 )
        target_pitch = -target_pitch;
      target_size = (FT_ULong)target_pitch * target->rows;

      if ( target_size != size )
        (void)FT_QREALLOC( target->buffer, target_size, size );
    }
    else
      (void)FT_QALLOC( target->buffer, size );

    if ( !error )
    {
      unsigned char *p;


      p = target->buffer;
      *target = *source;
      target->buffer = p;

      if ( source_pitch_sign == target_pitch_sign )
        FT_MEM_COPY( target->buffer, source->buffer, size );
      else
      {
        /* take care of bitmap flow */
        FT_UInt   i;
        FT_Byte*  s = source->buffer;
        FT_Byte*  t = target->buffer;


        t += (FT_ULong)pitch * ( target->rows - 1 );

        for ( i = target->rows; i > 0; i-- )
        {
          FT_ARRAY_COPY( t, s, pitch );

          s += pitch;
          t -= pitch;
        }
      }
    }

    return error;
  }